

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_pps.c
# Opt level: O2

MPP_RET process_pps(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *bitctx;
  h264_pps_t *__s;
  uint uVar1;
  h264d_cur_ctx_t *phVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  h264_pps_t *phVar5;
  char *fmt;
  long lVar6;
  RK_S32 *use_default;
  undefined8 uStackY_60;
  RK_U32 _out;
  RK_S32 *local_40;
  RK_S32 (*local_38) [64];
  
  phVar2 = currSlice->p_Cur;
  bitctx = &phVar2->bitctx;
  __s = &phVar2->pps;
  memset(__s,0,0x8b8);
  MVar3 = mpp_read_ue(bitctx,&_out);
  (phVar2->bitctx).ret = MVar3;
  if (MVar3 == MPP_OK) {
    (phVar2->pps).pic_parameter_set_id = _out;
    MVar3 = mpp_read_ue(bitctx,&_out);
    (phVar2->bitctx).ret = MVar3;
    if (MVar3 == MPP_OK) {
      (phVar2->pps).seq_parameter_set_id = _out;
      if (0x1f < _out) {
        (phVar2->pps).seq_parameter_set_id = 0;
      }
      if (0xff < (phVar2->pps).pic_parameter_set_id) {
        (phVar2->pps).pic_parameter_set_id = 0;
      }
      MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      (phVar2->bitctx).ret = MVar3;
      if (MVar3 == MPP_OK) {
        (phVar2->pps).entropy_coding_mode_flag = _out;
        MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
        (phVar2->bitctx).ret = MVar3;
        if (MVar3 == MPP_OK) {
          (phVar2->pps).bottom_field_pic_order_in_frame_present_flag = _out;
          MVar3 = mpp_read_ue(bitctx,&_out);
          (phVar2->bitctx).ret = MVar3;
          if (MVar3 == MPP_OK) {
            (phVar2->pps).num_slice_groups_minus1 = _out;
            if (1 < (int)_out) {
              MVar3 = MPP_ERR_VALUE;
              if (((byte)h264d_debug & 4) == 0) goto LAB_0018bf14;
              fmt = "value error(%d).\n";
              uStackY_60 = 0x52;
LAB_0018bf09:
              _mpp_log_l(4,"h264d_pps",fmt,(char *)0x0,uStackY_60);
              goto LAB_0018bf14;
            }
            MVar3 = mpp_read_ue(bitctx,&_out);
            (phVar2->bitctx).ret = MVar3;
            if (MVar3 == MPP_OK) {
              (phVar2->pps).num_ref_idx_l0_default_active_minus1 = _out;
              if (0x1f < (int)_out) {
                MVar3 = MPP_ERR_VALUE;
                if (((byte)h264d_debug & 4) == 0) goto LAB_0018bf14;
                fmt = "value error(%d).\n";
                uStackY_60 = 0x54;
                goto LAB_0018bf09;
              }
              MVar3 = mpp_read_ue(bitctx,&_out);
              (phVar2->bitctx).ret = MVar3;
              if (MVar3 == MPP_OK) {
                (phVar2->pps).num_ref_idx_l1_default_active_minus1 = _out;
                if (0x1f < (int)_out) {
                  MVar3 = MPP_ERR_VALUE;
                  if (((byte)h264d_debug & 4) == 0) goto LAB_0018bf14;
                  fmt = "value error(%d).\n";
                  uStackY_60 = 0x56;
                  goto LAB_0018bf09;
                }
                MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                (phVar2->bitctx).ret = MVar3;
                if (MVar3 == MPP_OK) {
                  (phVar2->pps).weighted_pred_flag = _out;
                  MVar3 = mpp_read_bits(bitctx,2,(RK_S32 *)&_out);
                  (phVar2->bitctx).ret = MVar3;
                  if (MVar3 == MPP_OK) {
                    (phVar2->pps).weighted_bipred_idc = _out;
                    if (2 < (int)_out) {
                      MVar3 = MPP_ERR_VALUE;
                      if (((byte)h264d_debug & 4) == 0) goto LAB_0018bf14;
                      fmt = "value error(%d).\n";
                      uStackY_60 = 0x59;
                      goto LAB_0018bf09;
                    }
                    MVar3 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                    (phVar2->bitctx).ret = MVar3;
                    if (MVar3 == MPP_OK) {
                      (phVar2->pps).pic_init_qp_minus26 = _out;
                      MVar3 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                      (phVar2->bitctx).ret = MVar3;
                      if (MVar3 == MPP_OK) {
                        (phVar2->pps).pic_init_qs_minus26 = _out;
                        MVar3 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                        (phVar2->bitctx).ret = MVar3;
                        if (MVar3 == MPP_OK) {
                          (phVar2->pps).chroma_qp_index_offset = _out;
                          (phVar2->pps).second_chroma_qp_index_offset = _out;
                          MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                          (phVar2->bitctx).ret = MVar3;
                          if (MVar3 == MPP_OK) {
                            (phVar2->pps).deblocking_filter_control_present_flag = _out;
                            MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                            (phVar2->bitctx).ret = MVar3;
                            if (MVar3 == MPP_OK) {
                              (phVar2->pps).constrained_intra_pred_flag = _out;
                              MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                              (phVar2->bitctx).ret = MVar3;
                              if (MVar3 == MPP_OK) {
                                (phVar2->pps).redundant_pic_cnt_present_flag = _out;
                                if (_out != 0) {
                                  MVar3 = MPP_ERR_VALUE;
                                  if (((byte)h264d_debug & 4) == 0) goto LAB_0018bf14;
                                  fmt = "value error(%d).\n";
                                  uStackY_60 = 0x61;
                                  goto LAB_0018bf09;
                                }
                                RVar4 = mpp_has_more_rbsp_data(bitctx);
                                if (RVar4 == 0) {
                                  (phVar2->pps).transform_8x8_mode_flag = 0;
                                  _out = (phVar2->pps).chroma_qp_index_offset;
                                  goto LAB_0018c0f2;
                                }
                                MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                (phVar2->bitctx).ret = MVar3;
                                if (MVar3 == MPP_OK) {
                                  (phVar2->pps).transform_8x8_mode_flag = _out;
                                  MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                  (phVar2->bitctx).ret = MVar3;
                                  if (MVar3 == MPP_OK) {
                                    (phVar2->pps).pic_scaling_matrix_present_flag = _out;
                                    if (_out != 0) {
                                      if (((byte)h264d_debug & 4) != 0) {
                                        _mpp_log_l(4,"h264d_pps","Picture scaling matrix present.",
                                                   (char *)0x0);
                                      }
                                      local_38 = (RK_S32 (*) [64])(phVar2->pps).ScalingList4x4;
                                      local_40 = (phVar2->pps).UseDefaultScalingMatrix4x4Flag;
                                      for (lVar6 = 0; lVar6 != 0x180; lVar6 = lVar6 + 0x40) {
                                        MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                        (phVar2->bitctx).ret = MVar3;
                                        if (MVar3 != MPP_OK) goto LAB_0018c1a1;
                                        local_40[-0x1ec] = _out;
                                        if ((_out != 0) &&
                                           (MVar3 = parse_scalingList(bitctx,0x10,
                                                                      (RK_S32 *)
                                                                      ((long)*local_38 + lVar6),
                                                                      local_40), MVar3 < MPP_OK)) {
                                          if (((byte)h264d_debug & 4) == 0) goto LAB_0018c1f8;
                                          uStackY_60 = 0x2d;
                                          goto LAB_0018c1dc;
                                        }
                                        local_40 = local_40 + 1;
                                      }
                                      if ((phVar2->pps).transform_8x8_mode_flag != 0) {
                                        local_38 = (phVar2->pps).ScalingList8x8;
                                        use_default = (phVar2->pps).UseDefaultScalingMatrix8x8Flag;
                                        for (local_40 = (RK_S32 *)0x0;
                                            local_40 <
                                            (undefined1 *)
                                            ((ulong)((phVar2->sps).chroma_format_idc == 3) * 4 + 2);
                                            local_40 = (RK_S32 *)((long)local_40 + 1)) {
                                          MVar3 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                          (phVar2->bitctx).ret = MVar3;
                                          if (MVar3 != MPP_OK) goto LAB_0018c1a1;
                                          use_default[-0x1ec] = _out;
                                          if ((_out != 0) &&
                                             (MVar3 = parse_scalingList(bitctx,0x40,*local_38,
                                                                        use_default), MVar3 < MPP_OK
                                             )) {
                                            if (((byte)h264d_debug & 4) != 0) {
                                              uStackY_60 = 0x35;
LAB_0018c1dc:
                                              _mpp_log_l(4,"h264d_pps","Function error(%d).\n",
                                                         (char *)0x0,uStackY_60);
                                            }
                                            goto LAB_0018c1f8;
                                          }
                                          use_default = use_default + 1;
                                          local_38 = local_38 + 1;
                                        }
                                      }
                                    }
                                    goto LAB_0018c1a7;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0018bc2b;
LAB_0018c1a1:
  if (MVar3 < MPP_OK) {
LAB_0018c1f8:
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018bf14;
    fmt = "Function error(%d).\n";
    uStackY_60 = 0x68;
    goto LAB_0018bf09;
  }
LAB_0018c1a7:
  MVar3 = mpp_read_se(bitctx,(RK_S32 *)&_out);
  (phVar2->bitctx).ret = MVar3;
  if (MVar3 == MPP_OK) {
LAB_0018c0f2:
    (phVar2->pps).second_chroma_qp_index_offset = _out;
    __s->Valid = 1;
    goto LAB_0018bc35;
  }
LAB_0018bc2b:
  if (MPP_NOK < MVar3) {
LAB_0018bc35:
    if (((((byte)h264d_debug & 2) != 0) && (__s->Valid != 1)) &&
       (_mpp_log_l(2,"h264d_pps","Assertion %s failed at %s:%d\n",(char *)0x0,"cur_pps->Valid == 1",
                   "process_pps",0x8e), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    phVar5 = currSlice->p_Vid->ppsSet[(phVar2->pps).pic_parameter_set_id];
    if (phVar5 == (h264_pps_t *)0x0) {
      phVar5 = (h264_pps_t *)mpp_osal_calloc("process_pps",0x8b8);
      uVar1 = (phVar2->pps).pic_parameter_set_id;
      currSlice->p_Vid->ppsSet[uVar1] = phVar5;
      phVar5 = currSlice->p_Vid->ppsSet[uVar1];
    }
    memcpy(phVar5,__s,0x8b8);
    phVar2->p_Vid->spspps_update = 1;
    return MPP_OK;
  }
LAB_0018bf14:
  if (((byte)h264d_debug & 4) == 0) {
    return MVar3;
  }
  _mpp_log_l(4,"h264d_pps","Function error(%d).\n",(char *)0x0,0x8c);
  return MVar3;
}

Assistant:

MPP_RET process_pps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_PPS_t *cur_pps = &p_Cur->pps;

    reset_curpps_data(cur_pps);// reset

    FUN_CHECK(ret = parser_pps(p_bitctx, &p_Cur->sps, cur_pps));
    //!< MakePPSavailable
    ASSERT(cur_pps->Valid == 1);
    if (!currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id]) {
        currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id] = mpp_calloc(H264_PPS_t, 1);
    }

    memcpy(currSlice->p_Vid->ppsSet[cur_pps->pic_parameter_set_id], cur_pps, sizeof(H264_PPS_t));
    p_Cur->p_Vid->spspps_update = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}